

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afangles.c
# Opt level: O0

void af_sort_and_quantize_widths(FT_UInt *count,AF_Width table,FT_Pos threshold)

{
  FT_Pos FVar1;
  FT_Pos FVar2;
  FT_Pos FVar3;
  AF_Width pAVar4;
  AF_Width pAVar5;
  AF_WidthRec swap;
  FT_Pos sum;
  FT_Pos cur_val;
  uint local_28;
  FT_UInt cur_idx;
  FT_UInt j;
  FT_UInt i;
  FT_Pos threshold_local;
  AF_Width table_local;
  FT_UInt *count_local;
  
  if (*count != 1) {
    for (cur_idx = 1; cur_idx < *count; cur_idx = cur_idx + 1) {
      local_28 = cur_idx;
      while ((local_28 != 0 && (table[local_28].org < table[local_28 - 1].org))) {
        pAVar4 = table + local_28;
        FVar1 = pAVar4->org;
        FVar2 = pAVar4->cur;
        FVar3 = pAVar4->fit;
        pAVar4 = table + local_28;
        pAVar5 = table + (local_28 - 1);
        pAVar4->org = pAVar5->org;
        pAVar4->cur = pAVar5->cur;
        pAVar4->fit = pAVar5->fit;
        pAVar4 = table + (local_28 - 1);
        pAVar4->org = FVar1;
        pAVar4->cur = FVar2;
        pAVar4->fit = FVar3;
        local_28 = local_28 - 1;
      }
    }
    cur_val._4_4_ = 0;
    sum = table->org;
    for (cur_idx = 1; cur_idx < *count; cur_idx = cur_idx + 1) {
      if ((threshold < table[cur_idx].org - sum) || (cur_idx == *count - 1)) {
        swap.fit = 0;
        if ((table[cur_idx].org - sum <= threshold) && (cur_idx == *count - 1)) {
          cur_idx = cur_idx + 1;
        }
        for (local_28 = cur_val._4_4_; local_28 < cur_idx; local_28 = local_28 + 1) {
          swap.fit = table[local_28].org + swap.fit;
          table[local_28].org = 0;
        }
        table[cur_val._4_4_].org = swap.fit / (long)(ulong)local_28;
        if (cur_idx < *count - 1) {
          cur_val._4_4_ = cur_idx + 1;
          sum = table[cur_val._4_4_].org;
        }
      }
    }
    cur_val._4_4_ = 1;
    for (cur_idx = 1; cur_idx < *count; cur_idx = cur_idx + 1) {
      if (table[cur_idx].org != 0) {
        pAVar4 = table + cur_val._4_4_;
        pAVar5 = table + cur_idx;
        pAVar4->org = pAVar5->org;
        pAVar4->cur = pAVar5->cur;
        pAVar4->fit = pAVar5->fit;
        cur_val._4_4_ = cur_val._4_4_ + 1;
      }
    }
    *count = cur_val._4_4_;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_sort_and_quantize_widths( FT_UInt*  count,
                               AF_Width  table,
                               FT_Pos    threshold )
  {
    FT_UInt      i, j;
    FT_UInt      cur_idx;
    FT_Pos       cur_val;
    FT_Pos       sum;
    AF_WidthRec  swap;


    if ( *count == 1 )
      return;

    /* sort */
    for ( i = 1; i < *count; i++ )
    {
      for ( j = i; j > 0; j-- )
      {
        if ( table[j].org >= table[j - 1].org )
          break;

        swap         = table[j];
        table[j]     = table[j - 1];
        table[j - 1] = swap;
      }
    }

    cur_idx = 0;
    cur_val = table[cur_idx].org;

    /* compute and use mean values for clusters not larger than  */
    /* `threshold'; this is very primitive and might not yield   */
    /* the best result, but normally, using reference character  */
    /* `o', `*count' is 2, so the code below is fully sufficient */
    for ( i = 1; i < *count; i++ )
    {
      if ( table[i].org - cur_val > threshold ||
           i == *count - 1                    )
      {
        sum = 0;

        /* fix loop for end of array */
        if ( table[i].org - cur_val <= threshold &&
             i == *count - 1                     )
          i++;

        for ( j = cur_idx; j < i; j++ )
        {
          sum         += table[j].org;
          table[j].org = 0;
        }
        table[cur_idx].org = sum / (FT_Pos)j;

        if ( i < *count - 1 )
        {
          cur_idx = i + 1;
          cur_val = table[cur_idx].org;
        }
      }
    }

    cur_idx = 1;

    /* compress array to remove zero values */
    for ( i = 1; i < *count; i++ )
    {
      if ( table[i].org )
        table[cur_idx++] = table[i];
    }

    *count = cur_idx;
  }